

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldAppearance.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::MinefieldAppearance::MinefieldAppearance
          (MinefieldAppearance *this,MinefieldType T,KBOOL IsStatusActive,KBOOL IsLaneActive,
          KBOOL IsStateActive)

{
  KBOOL IsStateActive_local;
  KBOOL IsLaneActive_local;
  KBOOL IsStatusActive_local;
  MinefieldType T_local;
  MinefieldAppearance *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__MinefieldAppearance_003321b8;
  (this->m_ui16BitUnion).m_ui16App = 0;
  (this->m_ui16BitUnion).m_ui16App = (this->m_ui16BitUnion).m_ui16App & 0xfffc | (ushort)T & 3;
  (this->m_ui16BitUnion).m_ui16App =
       (this->m_ui16BitUnion).m_ui16App & 0xfffb | (ushort)!IsStatusActive << 2;
  (this->m_ui16BitUnion).m_ui16App =
       (this->m_ui16BitUnion).m_ui16App & 0xfff7 | (ushort)!IsLaneActive << 3;
  (this->m_ui16BitUnion).m_ui16App =
       (this->m_ui16BitUnion).m_ui16App & 0xdfff | (ushort)!IsStateActive << 0xd;
  return;
}

Assistant:

MinefieldAppearance::MinefieldAppearance( MinefieldType T, KBOOL IsStatusActive, KBOOL IsLaneActive, KBOOL IsStateActive )
{
    m_ui16BitUnion.m_ui16App = 0;
    m_ui16BitUnion.m_ui16Type = T;
    m_ui16BitUnion.m_ui16ActiveStatus = (IsStatusActive ? 0 : 1);
    m_ui16BitUnion.m_ui16Lane = (IsLaneActive ? 0 : 1);
    m_ui16BitUnion.m_ui16State = (IsStateActive ? 0 : 1);
}